

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc-3339_converter.h
# Opt level: O3

bool date::date_converter<date::rfc3339,_long,_void>::from_parts(parts *parts,time_t *timepoint)

{
  undefined2 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined8 in_RAX;
  seconds_count sVar7;
  seconds_count sVar8;
  date_time local_28;
  
  local_28._7_1_ = SUB81((ulong)in_RAX >> 0x38,0);
  local_28.super_date.year = 0x7b2;
  local_28.super_date.month = '\x01';
  local_28.super_date.day = '\x01';
  local_28.super_time.hour = '\0';
  local_28.super_time.minute = '\0';
  local_28.super_time.second = '\0';
  sVar7 = calendar_helper::to_seconds_count(&local_28);
  uVar1 = parts->year;
  uVar2 = parts->month;
  uVar3 = parts->day;
  uVar4 = parts->hour;
  uVar5 = parts->minute;
  uVar6 = parts->second;
  local_28.super_time.second = uVar6;
  local_28.super_time.minute = uVar5;
  local_28.super_time.hour = uVar4;
  local_28.super_date.day = uVar3;
  local_28.super_date.month = uVar2;
  local_28.super_date.year = uVar1;
  sVar8 = calendar_helper::to_seconds_count(&local_28);
  *timepoint = (sVar8 - sVar7) + (long)parts->offset_in_minutes * -0x3c;
  return true;
}

Assistant:

static bool from_parts(const rfc3339::parts& parts, std::time_t& timepoint)
    {
        using date_time = calendar_helper::date_time;
        const auto epoch_offset = calendar_helper::to_seconds_count(date_time{ 1970, 1, 1, 0, 0, 0 });
        const auto seconds_count = calendar_helper::to_seconds_count(date_time{ parts.year, parts.month, parts.day, parts.hour, parts.minute, parts.second });
        timepoint = static_cast<std::time_t>(seconds_count - parts.offset_in_minutes * 60 - epoch_offset);
        return true;
    }